

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressSequencesLong
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  byte *pbVar1;
  BYTE *pBVar2;
  byte bVar3;
  byte bVar4;
  ZSTD_seqSymbol *prefixStart;
  undefined8 uVar5;
  ZSTD_seqSymbol ZVar6;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  seq_t sequence_02;
  seq_t sequence_03;
  seq_t sequence_04;
  U16 *pUVar7;
  U32 i;
  uint uVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  long lVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte **ppbVar16;
  ZSTD_seqSymbol *pZVar17;
  ZSTD_seqSymbol *pZVar18;
  uint uVar19;
  ZSTD_seqSymbol *pZVar20;
  ulong uVar21;
  size_t sVar22;
  ulong *puVar23;
  ulong *puVar24;
  ulong *puVar25;
  byte *pbVar26;
  ZSTD_seqSymbol *oend_00;
  ulong unaff_R12;
  ZSTD_seqSymbol *pZVar27;
  BYTE *oend;
  ulong uVar28;
  ZSTD_seqSymbol *pZVar29;
  ulong uVar30;
  bool bVar31;
  BYTE *litPtr;
  seq_t sequences [8];
  byte *local_218;
  byte *local_200;
  ulong local_1f8;
  BYTE *local_1f0;
  BYTE *local_1e8;
  ZSTD_seqSymbol *local_1e0;
  ulong local_1d8;
  BYTE *local_1d0;
  byte *local_1c8;
  ZSTD_seqSymbol *local_1c0;
  ZSTD_seqSymbol *local_1b8;
  byte *local_1b0;
  BIT_DStream_t local_1a8;
  ZSTD_fseState local_180;
  ZSTD_fseState local_170;
  ZSTD_fseState local_160;
  byte *local_150 [3];
  ulong uStack_138;
  BYTE *local_130;
  ZSTD_seqSymbol *local_128;
  byte *local_120;
  int local_114;
  ulong *local_110;
  ulong *local_108;
  ZSTD_seqSymbol *local_100;
  ulong local_f8;
  size_t local_f0;
  ulong local_e8 [23];
  
  if (dctx->bmi2 != 0) {
    sVar11 = ZSTD_decompressSequencesLong_bmi2
                       (dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset,frame);
    return sVar11;
  }
  if (dctx->litBufferLocation == ZSTD_in_dst) {
    oend_00 = (ZSTD_seqSymbol *)dctx->litBuffer;
  }
  else {
    oend_00 = (ZSTD_seqSymbol *)(maxDstSize + (long)dst);
  }
  local_200 = dctx->litPtr;
  local_218 = dctx->litBufferEnd;
  local_1d0 = (BYTE *)dst;
  if (nbSeq != 0) {
    prefixStart = (ZSTD_seqSymbol *)dctx->prefixStart;
    local_1e8 = (BYTE *)dctx->virtualStart;
    local_1f0 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar12 = -0xc;
    do {
      *(ulong *)((long)&uStack_138 + lVar12 * 2) =
           (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar12);
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0);
    iVar9 = 8;
    if (nbSeq < 8) {
      iVar9 = nbSeq;
    }
    if (dst == (void *)0x0) {
      __assert_fail("dst != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xab40,
                    "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                   );
    }
    local_1b8 = (ZSTD_seqSymbol *)((long)dst - (long)prefixStart);
    if ((long)seqSize < 0) {
      __assert_fail("iend >= ip",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xab41,
                    "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                   );
    }
    if (seqSize == 0) {
      local_1a8.ptr = (char *)0x0;
      local_1a8.start = (char *)0x0;
      local_1a8.bitContainer = 0;
      local_1a8._8_8_ = 0;
      local_1a8.limitPtr = (char *)0x0;
    }
    else {
      local_1a8.limitPtr = (char *)((long)seqStart + 8);
      local_1a8.start = (char *)seqStart;
      if (seqSize < 8) {
        local_1a8.bitContainer = (size_t)*seqStart;
        switch(seqSize) {
        case 7:
          local_1a8.bitContainer =
               (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_1a8.bitContainer;
        case 6:
          local_1a8.bitContainer =
               local_1a8.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_1a8.bitContainer =
               local_1a8.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
        }
        bVar3 = *(byte *)((long)seqStart + (seqSize - 1));
        uVar10 = 0x1f;
        if (bVar3 != 0) {
          for (; bVar3 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        local_1a8.bitsConsumed = ~uVar10 + 9;
        if (bVar3 == 0) {
          local_1a8.bitsConsumed = 0;
        }
        local_1a8.ptr = (char *)seqStart;
        if (bVar3 != 0) {
          local_1a8.bitsConsumed = local_1a8.bitsConsumed + (int)seqSize * -8 + 0x40;
          goto LAB_0018396c;
        }
      }
      else {
        local_1a8.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
        bVar3 = *(byte *)((long)seqStart + (seqSize - 1));
        uVar10 = 0x1f;
        if (bVar3 != 0) {
          for (; bVar3 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        local_1a8.bitsConsumed = ~uVar10 + 9;
        if (bVar3 == 0) {
          local_1a8.bitsConsumed = 0;
        }
        if (bVar3 != 0) {
LAB_0018396c:
          ZSTD_initFseState(&local_180,&local_1a8,dctx->LLTptr);
          ZSTD_initFseState(&local_170,&local_1a8,dctx->OFTptr);
          ZSTD_initFseState(&local_160,&local_1a8,dctx->MLTptr);
          local_1f8 = local_1a8.bitContainer;
          local_110 = (ulong *)local_1a8.limitPtr;
          local_100 = local_180.table;
          local_128 = local_160.table;
          local_114 = iVar9;
          local_130 = (BYTE *)(long)iVar9;
          puVar23 = local_e8;
          uVar21 = 0;
          local_1e0 = local_170.table;
          local_108 = (ulong *)local_1a8.start;
          puVar24 = (ulong *)local_1a8.start;
          puVar25 = (ulong *)local_1a8.ptr;
          uVar10 = local_1a8.bitsConsumed;
          do {
            uVar8 = uVar10;
            if (uVar10 < 0x41) {
              if (puVar25 < local_1a8.limitPtr) {
                if (puVar25 == puVar24) goto LAB_00183aca;
                uVar19 = (int)puVar25 - (int)puVar24;
                if (puVar24 <= (ulong *)((long)puVar25 - (ulong)(uVar10 >> 3))) {
                  uVar19 = uVar10 >> 3;
                }
                uVar8 = uVar10 + uVar19 * -8;
              }
              else {
                uVar19 = uVar10 >> 3;
                uVar8 = uVar10 & 7;
              }
              puVar25 = (ulong *)((long)puVar25 - (ulong)uVar19);
              local_1a8.bitsConsumed = uVar8;
              local_1f8 = *puVar25;
              local_1a8.bitContainer = local_1f8;
              local_1a8.ptr = (char *)puVar25;
            }
LAB_00183aca:
            local_1c8 = local_150[0];
            local_1b0 = local_150[1];
            if ((0x40 < uVar10) || ((long)local_130 <= (long)uVar21)) {
              dst = local_1d0;
              if ((long)uVar21 < (long)local_130) goto LAB_00184ec9;
              local_1c0 = oend_00 + -4;
              local_1c8 = dctx->litExtraBuffer;
              local_1b0 = dctx->litExtraBuffer + 0x10000;
              local_130 = dctx->litExtraBuffer + 0x10;
              goto LAB_00183edf;
            }
            bVar3 = local_180.table[local_180.state].nbAdditionalBits;
            if (0x10 < bVar3) goto LAB_00185b95;
            bVar14 = local_160.table[local_160.state].nbAdditionalBits;
            if (0x10 < bVar14) goto LAB_00185bb4;
            bVar4 = local_170.table[local_170.state].nbAdditionalBits;
            if (0x1f < bVar4) goto LAB_00185bd3;
            uVar28 = (ulong)local_160.table[local_160.state].baseValue;
            uVar10 = local_180.table[local_180.state].baseValue;
            uVar30 = (ulong)uVar10;
            local_120 = (byte *)(ulong)local_180.table[local_180.state].nextState;
            local_1d8 = (ulong)local_160.table[local_160.state].nextState;
            bVar15 = local_160.table[local_160.state].nbBits;
            local_1c0 = (ZSTD_seqSymbol *)CONCAT44(local_1c0._4_4_,(uint)bVar15);
            bVar13 = (byte)uVar8;
            if (bVar4 < 2) {
              if (bVar4 == 0) {
                pbVar26 = local_150[uVar10 == 0];
                local_150[0] = local_150[uVar10 != 0];
                goto LAB_00183bea;
              }
              uVar8 = uVar8 + 1;
              lVar12 = (ulong)(local_170.table[local_170.state].baseValue + (uint)(uVar10 == 0)) -
                       ((long)(local_1f8 << (bVar13 & 0x3f)) >> 0x3f);
              if (lVar12 == 3) {
                pbVar26 = local_150[0] + -1;
              }
              else {
                pbVar26 = local_150[lVar12];
              }
              pbVar26 = pbVar26 + (pbVar26 == (byte *)0x0);
              if (lVar12 != 1) {
                local_150[2] = local_150[1];
              }
            }
            else {
              uVar8 = uVar8 + bVar4;
              local_1a8._8_8_ = (ulong)(uint)local_1a8._12_4_ << 0x20;
              local_150[2] = local_150[1];
              pbVar26 = (byte *)(((local_1f8 << (bVar13 & 0x3f)) >> (-bVar4 & 0x3f)) +
                                (ulong)local_170.table[local_170.state].baseValue);
LAB_00183bea:
            }
            local_150[1] = local_150[0];
            local_150[0] = pbVar26;
            if (bVar14 != 0) {
              bVar13 = (byte)uVar8;
              uVar8 = uVar8 + bVar14;
              uVar28 = uVar28 + ((local_1f8 << (bVar13 & 0x3f)) >> (-bVar14 & 0x3f));
            }
            if ((0x1e < (byte)(bVar14 + bVar3 + bVar4)) && (uVar8 < 0x41)) {
              if (puVar25 < local_1a8.limitPtr) {
                if (puVar25 == (ulong *)local_1a8.start) goto LAB_00183c4c;
                uVar10 = (int)puVar25 - (int)local_1a8.start;
                if (local_1a8.start <= (ulong *)((long)puVar25 - (ulong)(uVar8 >> 3))) {
                  uVar10 = uVar8 >> 3;
                }
                uVar8 = uVar8 + uVar10 * -8;
              }
              else {
                uVar10 = uVar8 >> 3;
                uVar8 = uVar8 & 7;
              }
              puVar25 = (ulong *)((long)puVar25 - (ulong)uVar10);
              local_1f8 = *puVar25;
              local_1a8.bitContainer = local_1f8;
              local_1a8.ptr = (char *)puVar25;
            }
LAB_00183c4c:
            if (bVar3 != 0) {
              bVar14 = (byte)uVar8;
              uVar8 = uVar8 + bVar3;
              uVar30 = uVar30 + ((local_1f8 << (bVar14 & 0x3f)) >> (-bVar3 & 0x3f));
            }
            iVar9 = uVar8 + local_180.table[local_180.state].nbBits;
            local_180.state =
                 (size_t)((byte *)(ulong)local_180.table[local_180.state].nextState +
                         (~(-1L << (local_180.table[local_180.state].nbBits & 0x3f)) &
                         local_1f8 >> (-(char)iVar9 & 0x3fU)));
            iVar9 = iVar9 + (uint)bVar15;
            local_160.state =
                 (~(-1L << (bVar15 & 0x3f)) & local_1f8 >> (-(char)iVar9 & 0x3fU)) + local_1d8;
            uVar10 = iVar9 + (uint)local_170.table[local_170.state].nbBits;
            local_170.state =
                 (~(-1L << (local_170.table[local_170.state].nbBits & 0x3f)) &
                 local_1f8 >> (-(char)uVar10 & 0x3fU)) +
                 (ulong)local_170.table[local_170.state].nextState;
            local_1a8.bitsConsumed = uVar10;
            puVar23[-2] = uVar30;
            local_1b8 = (ZSTD_seqSymbol *)((byte *)((long)&local_1b8->nextState + uVar30) + uVar28);
            puVar23[-1] = uVar28;
            *puVar23 = (ulong)pbVar26;
            uVar21 = uVar21 + 1;
            puVar23 = puVar23 + 3;
            puVar24 = local_108;
          } while( true );
        }
      }
    }
    bVar31 = false;
    unaff_R12 = 0xffffffffffffffec;
    goto LAB_00185aac;
  }
  goto LAB_00185abc;
LAB_00183edf:
  uVar10 = local_1a8.bitsConsumed;
  if (local_1a8.bitsConsumed < 0x41) {
    if (local_1a8.ptr < local_1a8.limitPtr) {
      if (local_1a8.ptr == local_1a8.start) goto LAB_00183f6a;
      uVar8 = (int)local_1a8.ptr - (int)local_1a8.start;
      if (local_1a8.start <= (ulong *)((long)local_1a8.ptr - (ulong)(local_1a8.bitsConsumed >> 3)))
      {
        uVar8 = local_1a8.bitsConsumed >> 3;
      }
      uVar19 = local_1a8.bitsConsumed + uVar8 * -8;
    }
    else {
      uVar8 = local_1a8.bitsConsumed >> 3;
      uVar19 = local_1a8.bitsConsumed & 7;
    }
    local_1a8.ptr = (char *)((long)local_1a8.ptr - (ulong)uVar8);
    local_1a8.bitsConsumed = uVar19;
    local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
  }
LAB_00183f6a:
  uVar8 = (uint)uVar21;
  if ((0x40 < uVar10) || (nbSeq <= (int)uVar8)) {
    if ((int)uVar8 < nbSeq) goto LAB_00184ec9;
    uVar8 = uVar8 - local_114;
    goto joined_r0x00184ef1;
  }
  bVar3 = local_180.table[local_180.state].nbAdditionalBits;
  if (0x10 < bVar3) {
LAB_00185b95:
    __assert_fail("llBits <= MaxLLBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa948,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  bVar14 = local_160.table[local_160.state].nbAdditionalBits;
  if (0x10 < bVar14) {
LAB_00185bb4:
    __assert_fail("mlBits <= MaxMLBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa949,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  bVar4 = local_170.table[local_170.state].nbAdditionalBits;
  if (0x1f < bVar4) {
LAB_00185bd3:
    __assert_fail("ofBits <= MaxOff",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa94a,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  local_128 = (ZSTD_seqSymbol *)(ulong)local_160.table[local_160.state].baseValue;
  uVar10 = local_180.table[local_180.state].baseValue;
  local_1f8 = (ulong)uVar10;
  bVar15 = (byte)local_1a8.bitsConsumed;
  if (bVar4 < 2) {
    if (bVar4 != 0) {
      local_1a8.bitsConsumed = local_1a8.bitsConsumed + 1;
      lVar12 = (ulong)(local_170.table[local_170.state].baseValue + (uint)(uVar10 == 0)) -
               ((long)(local_1a8.bitContainer << (bVar15 & 0x3f)) >> 0x3f);
      if (lVar12 == 3) {
        local_150[0] = local_150[0] + -1;
      }
      else {
        local_150[0] = local_150[lVar12];
      }
      local_150[0] = local_150[0] + (local_150[0] == (byte *)0x0);
      if (lVar12 != 1) goto LAB_00184045;
      goto LAB_00184055;
    }
    local_150[0] = local_150[uVar10 == 0];
    ppbVar16 = local_150 + (uVar10 != 0);
  }
  else {
    local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar4;
    local_150[0] = (byte *)(((local_1a8.bitContainer << (bVar15 & 0x3f)) >> (-bVar4 & 0x3f)) +
                           (ulong)local_170.table[local_170.state].baseValue);
LAB_00184045:
    local_150[2] = local_150[1];
LAB_00184055:
    ppbVar16 = local_150;
  }
  local_150[1] = *ppbVar16;
  if (bVar14 != 0) {
    bVar15 = (byte)local_1a8.bitsConsumed;
    local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar14;
    local_128 = (ZSTD_seqSymbol *)
                ((long)&((ZSTD_seqSymbol *)(ulong)local_160.table[local_160.state].baseValue)->
                        nextState +
                ((local_1a8.bitContainer << (bVar15 & 0x3f)) >> (-bVar14 & 0x3f)));
  }
  if ((0x1e < (byte)(bVar14 + bVar3 + bVar4)) && (local_1a8.bitsConsumed < 0x41)) {
    if (local_1a8.ptr < local_1a8.limitPtr) {
      if (local_1a8.ptr == local_1a8.start) goto LAB_001840dd;
      uVar21 = (ulong)(uint)((int)local_1a8.ptr - (int)local_1a8.start);
      if (local_1a8.start <= (ulong *)((long)local_1a8.ptr - (ulong)(local_1a8.bitsConsumed >> 3)))
      {
        uVar21 = (ulong)(local_1a8.bitsConsumed >> 3);
      }
      uVar10 = local_1a8.bitsConsumed + (int)uVar21 * -8;
    }
    else {
      uVar21 = (ulong)(local_1a8.bitsConsumed >> 3);
      uVar10 = local_1a8.bitsConsumed & 7;
    }
    local_1a8.ptr = (char *)((long)local_1a8.ptr - uVar21);
    local_1a8.bitsConsumed = uVar10;
    local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
  }
LAB_001840dd:
  if (bVar3 != 0) {
    bVar14 = (byte)local_1a8.bitsConsumed;
    local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar3;
    local_1f8 = local_1f8 + ((local_1a8.bitContainer << (bVar14 & 0x3f)) >> (-bVar3 & 0x3f));
  }
  iVar9 = local_180.table[local_180.state].nbBits + local_1a8.bitsConsumed;
  local_180.state =
       (~(-1L << (local_180.table[local_180.state].nbBits & 0x3f)) &
       local_1a8.bitContainer >> (-(char)iVar9 & 0x3fU)) +
       (ulong)local_180.table[local_180.state].nextState;
  iVar9 = iVar9 + (uint)local_160.table[local_160.state].nbBits;
  local_160.state =
       (~(-1L << (local_160.table[local_160.state].nbBits & 0x3f)) &
       local_1a8.bitContainer >> (-(char)iVar9 & 0x3fU)) +
       (ulong)local_160.table[local_160.state].nextState;
  iVar9 = iVar9 + (uint)local_170.table[local_170.state].nbBits;
  local_1a8.bitsConsumed = iVar9;
  local_170.state =
       (~(-1L << (local_170.table[local_170.state].nbBits & 0x3f)) &
       local_1a8.bitContainer >> (-(char)iVar9 & 0x3fU)) +
       (ulong)local_170.table[local_170.state].nextState;
  local_120 = local_150[0];
  if (dctx->litBufferLocation == ZSTD_split) {
    uVar30 = (ulong)(uVar8 & 7);
    puVar23 = &local_f8 + uVar30 * 3;
    uVar21 = *puVar23;
    pbVar26 = local_200 + uVar21;
    if (dctx->litBufferEnd < pbVar26) {
      uVar21 = (long)dctx->litBufferEnd - (long)local_200;
      if (uVar21 == 0) {
LAB_00184592:
        local_200 = local_1c8;
        dctx->litBufferLocation = ZSTD_not_in_dst;
        if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00185c11;
        uVar21 = *puVar23;
        if ((long)uVar21 < 0x10001) {
          sVar22 = (&local_f0)[uVar30 * 3];
          unaff_R12 = uVar21 + sVar22;
          pZVar20 = (ZSTD_seqSymbol *)((long)dst + unaff_R12);
          if (local_1c0 < pZVar20) goto LAB_00184a74;
          if ((long)uVar21 < 0) goto LAB_00185c4f;
          if ((long)unaff_R12 <= (long)uVar21) goto LAB_00185c30;
          if (oend_00 < pZVar20) goto LAB_00185c6e;
          pZVar29 = (ZSTD_seqSymbol *)((long)dst + uVar21);
          if (local_1c0 < pZVar29) goto LAB_00185c8d;
          uVar28 = local_e8[uVar30 * 3];
          uVar5 = *(undefined8 *)(local_1c8 + 8);
          *(undefined8 *)dst = *(undefined8 *)local_1c8;
          *(undefined8 *)((long)dst + 8) = uVar5;
          if (0x10 < uVar21) {
            local_1e0 = pZVar20;
            if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)dst + 0x10) + (-0x10 - (long)local_130))
            goto LAB_00185bf2;
            uVar5 = *(undefined8 *)(local_130 + 8);
            *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)local_130;
            *(undefined8 *)((long)dst + 0x18) = uVar5;
            if (0x20 < (long)uVar21) {
              lVar12 = 0;
              do {
                uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x20 + 8);
                pBVar2 = (BYTE *)((long)dst + lVar12 + 0x20);
                *(undefined8 *)pBVar2 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x20);
                *(undefined8 *)(pBVar2 + 8) = uVar5;
                uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x30 + 8);
                *(undefined8 *)(pBVar2 + 0x10) =
                     *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x30);
                *(undefined8 *)(pBVar2 + 0x18) = uVar5;
                lVar12 = lVar12 + 0x20;
              } while ((ZSTD_seqSymbol *)(pBVar2 + 0x20) < pZVar29);
            }
          }
          local_200 = local_1c8 + uVar21;
          pZVar27 = (ZSTD_seqSymbol *)((long)pZVar29 - uVar28);
          if ((ulong)((long)pZVar29 - (long)prefixStart) < uVar28) {
            if ((ulong)((long)pZVar29 - (long)local_1e8) < uVar28) {
              unaff_R12 = 0xffffffffffffffec;
              local_1e0 = pZVar20;
            }
            else {
              lVar12 = (long)((long)pZVar29 - uVar28) - (long)prefixStart;
              pBVar2 = local_1f0 + lVar12;
              if (local_1f0 < pBVar2 + sVar22) {
                local_1e0 = pZVar20;
                memmove(pZVar29,pBVar2,-lVar12);
                pZVar29 = (ZSTD_seqSymbol *)((long)pZVar29 - lVar12);
                sVar22 = sVar22 + lVar12;
                pZVar20 = local_1e0;
                pZVar27 = prefixStart;
                goto LAB_001846b2;
              }
              local_1e0 = pZVar20;
              memmove(pZVar29,pBVar2,sVar22);
            }
          }
          else {
LAB_001846b2:
            if (pZVar20 < pZVar29) goto LAB_00185ccb;
            if (pZVar27 < prefixStart) goto LAB_00185cea;
            if (sVar22 == 0) goto LAB_00185cac;
            if (uVar28 < 0x10) {
              if (pZVar29 < pZVar27) goto LAB_00185e5e;
              if (uVar28 < 8) {
                iVar9 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar28 * 4);
                *(byte *)&pZVar29->nextState = (byte)pZVar27->nextState;
                *(byte *)((long)&pZVar29->nextState + 1) = *(byte *)((long)&pZVar27->nextState + 1);
                pZVar29->nbAdditionalBits = pZVar27->nbAdditionalBits;
                pZVar29->nbBits = pZVar27->nbBits;
                pUVar7 = &pZVar27->nextState;
                pZVar27 = (ZSTD_seqSymbol *)
                          ((long)pZVar27 +
                          ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar28 * 4) - (long)iVar9
                          ));
                pZVar29->baseValue =
                     *(U32 *)((long)pUVar7 +
                             (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar28 * 4));
              }
              else {
                *pZVar29 = *pZVar27;
              }
              pZVar18 = pZVar27 + 1;
              pZVar17 = pZVar29 + 1;
              lVar12 = (long)pZVar17 - (long)pZVar18;
              if (lVar12 < 8) goto LAB_00185e7d;
              if (8 < sVar22) {
                if (pZVar20 <= pZVar17) goto LAB_00185e9c;
                pZVar20 = (ZSTD_seqSymbol *)((long)&pZVar29->nextState + sVar22);
                if (lVar12 < 0x10) {
                  do {
                    *pZVar17 = *pZVar18;
                    pZVar17 = pZVar17 + 1;
                    pZVar18 = pZVar18 + 1;
                  } while (pZVar17 < pZVar20);
                }
                else {
                  if (0xffffffffffffffe0 < lVar12 - 0x10U) goto LAB_00185bf2;
                  ZVar6 = pZVar27[2];
                  *pZVar17 = *pZVar18;
                  pZVar29[2] = ZVar6;
                  if (0x18 < (long)sVar22) {
                    lVar12 = 0;
                    do {
                      pbVar1 = (byte *)((long)&pZVar27[3].nextState + lVar12);
                      uVar5 = *(undefined8 *)(pbVar1 + 8);
                      pbVar26 = (byte *)((long)&pZVar29[3].nextState + lVar12);
                      *(undefined8 *)pbVar26 = *(undefined8 *)pbVar1;
                      *(undefined8 *)(pbVar26 + 8) = uVar5;
                      pbVar1 = (byte *)((long)&pZVar27[5].nextState + lVar12);
                      uVar5 = *(undefined8 *)(pbVar1 + 8);
                      *(undefined8 *)(pbVar26 + 0x10) = *(undefined8 *)pbVar1;
                      *(undefined8 *)(pbVar26 + 0x18) = uVar5;
                      lVar12 = lVar12 + 0x20;
                    } while ((ZSTD_seqSymbol *)(pbVar26 + 0x20) < pZVar20);
                  }
                }
              }
            }
            else {
              if ((byte *)0xffffffffffffffe0 < (byte *)((long)pZVar29 + (-0x10 - (long)pZVar27)))
              goto LAB_00185bf2;
              ZVar6 = pZVar27[1];
              *pZVar29 = *pZVar27;
              pZVar29[1] = ZVar6;
              if (0x10 < (long)sVar22) {
                lVar12 = 0x10;
                do {
                  pbVar26 = (byte *)((long)&pZVar27->nextState + lVar12);
                  uVar5 = *(undefined8 *)(pbVar26 + 8);
                  pbVar1 = (byte *)((long)&pZVar29->nextState + lVar12);
                  *(undefined8 *)pbVar1 = *(undefined8 *)pbVar26;
                  *(undefined8 *)(pbVar1 + 8) = uVar5;
                  pbVar26 = (byte *)((long)&pZVar27[2].nextState + lVar12);
                  uVar5 = *(undefined8 *)(pbVar26 + 8);
                  *(undefined8 *)(pbVar1 + 0x10) = *(undefined8 *)pbVar26;
                  *(undefined8 *)(pbVar1 + 0x18) = uVar5;
                  lVar12 = lVar12 + 0x20;
                } while (pbVar1 + 0x20 < (byte *)((long)&pZVar29->nextState + sVar22));
              }
            }
          }
        }
        else {
LAB_00184a74:
          sequence_01.matchLength = (&local_f0)[uVar30 * 3];
          sequence_01.litLength = *puVar23;
          sequence_01.offset = local_e8[uVar30 * 3];
          unaff_R12 = ZSTD_execSequenceEnd
                                ((BYTE *)dst,(BYTE *)oend_00,sequence_01,&local_200,local_1b0,
                                 (BYTE *)prefixStart,local_1e8,local_1f0);
        }
        local_218 = local_1b0;
        if (0xffffffffffffff88 < unaff_R12) {
          bVar31 = false;
          goto LAB_001847d9;
        }
        local_1b8 = (ZSTD_seqSymbol *)
                    ((byte *)((long)&local_1b8->nextState + local_1f8) + (long)local_128);
        *puVar23 = local_1f8;
        (&local_f0)[uVar30 * 3] = (size_t)local_128;
        local_e8[uVar30 * 3] = (ulong)local_120;
        dst = (void *)((long)dst + unaff_R12);
        goto LAB_001847cd;
      }
      if (uVar21 <= (ulong)((long)oend_00 - (long)dst)) {
        ZSTD_safecopyDstBeforeSrc((BYTE *)dst,local_200,uVar21);
        *puVar23 = *puVar23 - uVar21;
        dst = (void *)((long)dst + uVar21);
        goto LAB_00184592;
      }
      bVar31 = false;
      unaff_R12 = 0xffffffffffffffba;
      goto LAB_001847d9;
    }
    if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00185d47;
    pZVar20 = (ZSTD_seqSymbol *)(pbVar26 + -0x20);
    if (oend_00 <= pZVar20) goto LAB_00185d66;
    if (local_218 < pbVar26) {
LAB_0018499c:
      sequence_00.matchLength = (&local_f0)[uVar30 * 3];
      sequence_00.litLength = *puVar23;
      sequence_00.offset = local_e8[uVar30 * 3];
      unaff_R12 = ZSTD_execSequenceEndSplitLitBuffer
                            ((BYTE *)dst,(BYTE *)oend_00,(BYTE *)pZVar20,sequence_00,&local_200,
                             local_218,(BYTE *)prefixStart,local_1e8,local_1f0);
      goto LAB_0018475c;
    }
    sVar22 = (&local_f0)[uVar30 * 3];
    unaff_R12 = sVar22 + uVar21;
    pZVar29 = (ZSTD_seqSymbol *)((long)dst + unaff_R12);
    if (pZVar20 < pZVar29) goto LAB_0018499c;
    if ((long)uVar21 < 0) goto LAB_00185dc3;
    if ((long)unaff_R12 <= (long)uVar21) goto LAB_00185de2;
    if (oend_00 < pZVar29) goto LAB_00185da4;
    pZVar27 = (ZSTD_seqSymbol *)((long)dst + uVar21);
    if (pZVar20 < pZVar27) goto LAB_00185d85;
    uVar30 = local_e8[uVar30 * 3];
    uVar5 = *(undefined8 *)(local_200 + 8);
    *(undefined8 *)dst = *(undefined8 *)local_200;
    *(undefined8 *)((long)dst + 8) = uVar5;
    if (0x10 < uVar21) {
      ZSTD_decompressSequencesLong_cold_4();
    }
    pZVar20 = (ZSTD_seqSymbol *)((long)pZVar27 - uVar30);
    local_200 = pbVar26;
    if ((ulong)((long)pZVar27 - (long)prefixStart) < uVar30) {
      if ((ulong)((long)pZVar27 - (long)local_1e8) < uVar30) {
        unaff_R12 = 0xffffffffffffffec;
      }
      else {
        lVar12 = (long)pZVar20 - (long)prefixStart;
        pBVar2 = local_1f0 + lVar12;
        if (local_1f0 < pBVar2 + sVar22) {
          local_1e0 = pZVar29;
          memmove(pZVar27,pBVar2,-lVar12);
          pZVar27 = (ZSTD_seqSymbol *)((long)pZVar27 - lVar12);
          sVar22 = sVar22 + lVar12;
          pZVar20 = prefixStart;
          pZVar29 = local_1e0;
          goto LAB_001844ca;
        }
        memmove(pZVar27,pBVar2,sVar22);
      }
    }
    else {
LAB_001844ca:
      if (pZVar29 < pZVar27) goto LAB_00185e3f;
      if (pZVar20 < prefixStart) goto LAB_00185e20;
      if (sVar22 == 0) goto LAB_00185e01;
      if (uVar30 < 0x10) {
        if (pZVar27 < pZVar20) goto LAB_00185e5e;
        if (uVar30 < 8) {
          iVar9 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar30 * 4);
          *(byte *)&pZVar27->nextState = (byte)pZVar20->nextState;
          *(byte *)((long)&pZVar27->nextState + 1) = *(byte *)((long)&pZVar20->nextState + 1);
          pZVar27->nbAdditionalBits = pZVar20->nbAdditionalBits;
          pZVar27->nbBits = pZVar20->nbBits;
          pUVar7 = &pZVar20->nextState;
          pZVar20 = (ZSTD_seqSymbol *)
                    ((long)pZVar20 +
                    ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar30 * 4) - (long)iVar9));
          pZVar27->baseValue =
               *(U32 *)((long)pUVar7 + (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar30 * 4));
        }
        else {
          *pZVar27 = *pZVar20;
        }
        pZVar17 = pZVar20 + 1;
        pZVar18 = pZVar27 + 1;
        lVar12 = (long)pZVar18 - (long)pZVar17;
        if (lVar12 < 8) goto LAB_00185e7d;
        if (8 < sVar22) {
          if (pZVar29 <= pZVar18) goto LAB_00185ebb;
          pZVar29 = (ZSTD_seqSymbol *)((long)&pZVar27->nextState + sVar22);
          if (lVar12 < 0x10) {
            do {
              *pZVar18 = *pZVar17;
              pZVar18 = pZVar18 + 1;
              pZVar17 = pZVar17 + 1;
            } while (pZVar18 < pZVar29);
            goto LAB_0018475c;
          }
          if (0xffffffffffffffe0 < lVar12 - 0x10U) goto LAB_00185bf2;
          ZVar6 = pZVar20[2];
          *pZVar18 = *pZVar17;
          pZVar27[2] = ZVar6;
          if (0x18 < (long)sVar22) {
            lVar12 = 0;
            do {
              pbVar1 = (byte *)((long)&pZVar20[3].nextState + lVar12);
              uVar5 = *(undefined8 *)(pbVar1 + 8);
              pbVar26 = (byte *)((long)&pZVar27[3].nextState + lVar12);
              *(undefined8 *)pbVar26 = *(undefined8 *)pbVar1;
              *(undefined8 *)(pbVar26 + 8) = uVar5;
              pbVar1 = (byte *)((long)&pZVar20[5].nextState + lVar12);
              uVar5 = *(undefined8 *)(pbVar1 + 8);
              *(undefined8 *)(pbVar26 + 0x10) = *(undefined8 *)pbVar1;
              *(undefined8 *)(pbVar26 + 0x18) = uVar5;
              lVar12 = lVar12 + 0x20;
            } while ((ZSTD_seqSymbol *)(pbVar26 + 0x20) < pZVar29);
          }
        }
      }
      else {
        if ((byte *)0xffffffffffffffe0 < (byte *)((long)pZVar27 + (-0x10 - (long)pZVar20)))
        goto LAB_00185bf2;
        ZVar6 = pZVar20[1];
        *pZVar27 = *pZVar20;
        pZVar27[1] = ZVar6;
        if (0x10 < (long)sVar22) {
          lVar12 = 0x10;
          do {
            pbVar26 = (byte *)((long)&pZVar20->nextState + lVar12);
            uVar5 = *(undefined8 *)(pbVar26 + 8);
            pbVar1 = (byte *)((long)&pZVar27->nextState + lVar12);
            *(undefined8 *)pbVar1 = *(undefined8 *)pbVar26;
            *(undefined8 *)(pbVar1 + 8) = uVar5;
            pbVar26 = (byte *)((long)&pZVar20[2].nextState + lVar12);
            uVar5 = *(undefined8 *)(pbVar26 + 8);
            *(undefined8 *)(pbVar1 + 0x10) = *(undefined8 *)pbVar26;
            *(undefined8 *)(pbVar1 + 0x18) = uVar5;
            lVar12 = lVar12 + 0x20;
          } while (pbVar1 + 0x20 < (byte *)((long)&pZVar27->nextState + sVar22));
        }
      }
    }
  }
  else {
    if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00185c11;
    uVar30 = (ulong)(uVar8 & 7);
    uVar21 = (&local_f8)[uVar30 * 3];
    pbVar26 = local_200 + uVar21;
    if (local_218 < pbVar26) {
LAB_00184909:
      sequence.matchLength = (&local_f0)[uVar30 * 3];
      sequence.litLength = (&local_f8)[uVar30 * 3];
      sequence.offset = local_e8[uVar30 * 3];
      unaff_R12 = ZSTD_execSequenceEnd
                            ((BYTE *)dst,(BYTE *)oend_00,sequence,&local_200,local_218,
                             (BYTE *)prefixStart,local_1e8,local_1f0);
    }
    else {
      sVar22 = (&local_f0)[uVar30 * 3];
      unaff_R12 = sVar22 + uVar21;
      pZVar20 = (ZSTD_seqSymbol *)((long)dst + unaff_R12);
      if (local_1c0 < pZVar20) goto LAB_00184909;
      if ((long)uVar21 < 0) goto LAB_00185c4f;
      if ((long)unaff_R12 <= (long)uVar21) goto LAB_00185c30;
      if (oend_00 < pZVar20) goto LAB_00185c6e;
      pZVar29 = (ZSTD_seqSymbol *)((long)dst + uVar21);
      if (local_1c0 < pZVar29) goto LAB_00185c8d;
      uVar30 = local_e8[uVar30 * 3];
      uVar5 = *(undefined8 *)(local_200 + 8);
      *(undefined8 *)dst = *(undefined8 *)local_200;
      *(undefined8 *)((long)dst + 8) = uVar5;
      if (0x10 < uVar21) {
        ZSTD_decompressSequencesLong_cold_3();
      }
      pZVar27 = (ZSTD_seqSymbol *)((long)pZVar29 - uVar30);
      local_200 = pbVar26;
      if ((ulong)((long)pZVar29 - (long)prefixStart) < uVar30) {
        if ((ulong)((long)pZVar29 - (long)local_1e8) < uVar30) {
          unaff_R12 = 0xffffffffffffffec;
        }
        else {
          lVar12 = (long)((long)pZVar29 - uVar30) - (long)prefixStart;
          pBVar2 = local_1f0 + lVar12;
          if (local_1f0 < pBVar2 + sVar22) {
            memmove(pZVar29,pBVar2,-lVar12);
            pZVar29 = (ZSTD_seqSymbol *)((long)pZVar29 - lVar12);
            sVar22 = sVar22 + lVar12;
            pZVar27 = prefixStart;
            goto LAB_00184345;
          }
          memmove(pZVar29,pBVar2,sVar22);
        }
      }
      else {
LAB_00184345:
        if (pZVar20 < pZVar29) goto LAB_00185ccb;
        if (pZVar27 < prefixStart) goto LAB_00185cea;
        if (sVar22 == 0) goto LAB_00185cac;
        if (uVar30 < 0x10) {
          if (pZVar29 < pZVar27) goto LAB_00185e5e;
          if (uVar30 < 8) {
            iVar9 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar30 * 4);
            *(byte *)&pZVar29->nextState = (byte)pZVar27->nextState;
            *(byte *)((long)&pZVar29->nextState + 1) = *(byte *)((long)&pZVar27->nextState + 1);
            pZVar29->nbAdditionalBits = pZVar27->nbAdditionalBits;
            pZVar29->nbBits = pZVar27->nbBits;
            pUVar7 = &pZVar27->nextState;
            pZVar27 = (ZSTD_seqSymbol *)
                      ((long)pZVar27 +
                      ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar30 * 4) - (long)iVar9));
            pZVar29->baseValue =
                 *(U32 *)((long)pUVar7 + (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar30 * 4)
                         );
          }
          else {
            *pZVar29 = *pZVar27;
          }
          pZVar17 = pZVar27 + 1;
          pZVar18 = pZVar29 + 1;
          lVar12 = (long)pZVar18 - (long)pZVar17;
          if (lVar12 < 8) goto LAB_00185e7d;
          if (8 < sVar22) {
            if (pZVar20 <= pZVar18) goto LAB_00185e9c;
            pZVar20 = (ZSTD_seqSymbol *)((long)&pZVar29->nextState + sVar22);
            if (lVar12 < 0x10) {
              do {
                *pZVar18 = *pZVar17;
                pZVar18 = pZVar18 + 1;
                pZVar17 = pZVar17 + 1;
              } while (pZVar18 < pZVar20);
            }
            else {
              if (0xffffffffffffffe0 < lVar12 - 0x10U) goto LAB_00185bf2;
              ZVar6 = pZVar27[2];
              *pZVar18 = *pZVar17;
              pZVar29[2] = ZVar6;
              if (0x18 < (long)sVar22) {
                lVar12 = 0;
                do {
                  pbVar1 = (byte *)((long)&pZVar27[3].nextState + lVar12);
                  uVar5 = *(undefined8 *)(pbVar1 + 8);
                  pbVar26 = (byte *)((long)&pZVar29[3].nextState + lVar12);
                  *(undefined8 *)pbVar26 = *(undefined8 *)pbVar1;
                  *(undefined8 *)(pbVar26 + 8) = uVar5;
                  pbVar1 = (byte *)((long)&pZVar27[5].nextState + lVar12);
                  uVar5 = *(undefined8 *)(pbVar1 + 8);
                  *(undefined8 *)(pbVar26 + 0x10) = *(undefined8 *)pbVar1;
                  *(undefined8 *)(pbVar26 + 0x18) = uVar5;
                  lVar12 = lVar12 + 0x20;
                } while ((ZSTD_seqSymbol *)(pbVar26 + 0x20) < pZVar20);
              }
            }
          }
        }
        else {
          if ((byte *)0xffffffffffffffe0 < (byte *)((long)pZVar29 + (-0x10 - (long)pZVar27)))
          goto LAB_00185bf2;
          ZVar6 = pZVar27[1];
          *pZVar29 = *pZVar27;
          pZVar29[1] = ZVar6;
          if (0x10 < (long)sVar22) {
            lVar12 = 0x10;
            do {
              pbVar26 = (byte *)((long)&pZVar27->nextState + lVar12);
              uVar5 = *(undefined8 *)(pbVar26 + 8);
              pbVar1 = (byte *)((long)&pZVar29->nextState + lVar12);
              *(undefined8 *)pbVar1 = *(undefined8 *)pbVar26;
              *(undefined8 *)(pbVar1 + 8) = uVar5;
              pbVar26 = (byte *)((long)&pZVar27[2].nextState + lVar12);
              uVar5 = *(undefined8 *)(pbVar26 + 8);
              *(undefined8 *)(pbVar1 + 0x10) = *(undefined8 *)pbVar26;
              *(undefined8 *)(pbVar1 + 0x18) = uVar5;
              lVar12 = lVar12 + 0x20;
            } while (pbVar1 + 0x20 < (byte *)((long)&pZVar29->nextState + sVar22));
          }
        }
      }
    }
  }
LAB_0018475c:
  if (unaff_R12 < 0xffffffffffffff89) {
    local_1b8 = (ZSTD_seqSymbol *)
                ((byte *)((long)&local_1b8->nextState + local_1f8) + (long)local_128);
    uVar21 = (ulong)(uVar8 & 7);
    (&local_f8)[uVar21 * 3] = local_1f8;
    (&local_f0)[uVar21 * 3] = (size_t)local_128;
    local_e8[uVar21 * 3] = (ulong)local_120;
    dst = (void *)((long)dst + unaff_R12);
LAB_001847cd:
    bVar31 = true;
    unaff_R12 = local_1d8;
  }
  else {
    bVar31 = false;
  }
LAB_001847d9:
  if (!bVar31) goto LAB_00184eda;
  uVar21 = (ulong)(uVar8 + 1);
  local_1d8 = unaff_R12;
  goto LAB_00183edf;
LAB_00184ec9:
  bVar31 = false;
  unaff_R12 = 0xffffffffffffffec;
  goto LAB_00185aac;
joined_r0x00184ef1:
  if (nbSeq <= (int)uVar8) goto LAB_00185a84;
  uVar21 = (ulong)(uVar8 & 7);
  puVar23 = &local_f8 + uVar21 * 3;
  if (dctx->litBufferLocation == ZSTD_split) {
    uVar30 = *puVar23;
    pbVar26 = local_200 + uVar30;
    if (dctx->litBufferEnd < pbVar26) {
      uVar30 = (long)dctx->litBufferEnd - (long)local_200;
      if (uVar30 == 0) {
LAB_001852cb:
        local_200 = local_1c8;
        dctx->litBufferLocation = ZSTD_not_in_dst;
        if ((BYTE *)dst == (BYTE *)0x0) {
LAB_00185c11:
          __assert_fail("op != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa850,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        uVar30 = *puVar23;
        if ((long)uVar30 < 0x10001) {
          sVar22 = (&local_f0)[uVar21 * 3];
          uVar28 = sVar22 + uVar30;
          pZVar20 = (ZSTD_seqSymbol *)((long)dst + uVar28);
          if (local_1c0 < pZVar20) goto LAB_00185677;
          if ((long)uVar30 < 0) {
LAB_00185c4f:
            __assert_fail("op <= oLitEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa863,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if ((long)uVar28 <= (long)uVar30) {
LAB_00185c30:
            __assert_fail("oLitEnd < oMatchEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa864,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (oend_00 < pZVar20) {
LAB_00185c6e:
            __assert_fail("oMatchEnd <= oend",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa865,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          pZVar29 = (ZSTD_seqSymbol *)((long)dst + uVar30);
          if (local_1c0 < pZVar29) {
LAB_00185c8d:
            __assert_fail("oLitEnd <= oend_w",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa867,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          uVar21 = local_e8[uVar21 * 3];
          uVar5 = *(undefined8 *)(local_1c8 + 8);
          *(undefined8 *)dst = *(undefined8 *)local_1c8;
          *(undefined8 *)((long)dst + 8) = uVar5;
          if (0x10 < uVar30) {
            if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)dst + 0x10) + (-0x10 - (long)local_130))
            {
LAB_00185bf2:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar5 = *(undefined8 *)(local_130 + 8);
            *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)local_130;
            *(undefined8 *)((long)dst + 0x18) = uVar5;
            if (0x20 < (long)uVar30) {
              lVar12 = 0;
              do {
                uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x20 + 8);
                pBVar2 = (BYTE *)((long)dst + lVar12 + 0x20);
                *(undefined8 *)pBVar2 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x20);
                *(undefined8 *)(pBVar2 + 8) = uVar5;
                uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x30 + 8);
                *(undefined8 *)(pBVar2 + 0x10) =
                     *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x30);
                *(undefined8 *)(pBVar2 + 0x18) = uVar5;
                lVar12 = lVar12 + 0x20;
              } while ((ZSTD_seqSymbol *)(pBVar2 + 0x20) < pZVar29);
            }
          }
          local_200 = local_1c8 + uVar30;
          pZVar27 = (ZSTD_seqSymbol *)((long)pZVar29 - uVar21);
          if ((ulong)((long)pZVar29 - (long)prefixStart) < uVar21) {
            local_1f8 = uVar28;
            if ((ulong)((long)pZVar29 - (long)local_1e8) < uVar21) {
              uVar28 = 0xffffffffffffffec;
            }
            else {
              lVar12 = (long)((long)pZVar29 - uVar21) - (long)prefixStart;
              pBVar2 = local_1f0 + lVar12;
              if (local_1f0 < pBVar2 + sVar22) {
                memmove(pZVar29,pBVar2,-lVar12);
                pZVar29 = (ZSTD_seqSymbol *)((long)pZVar29 - lVar12);
                sVar22 = sVar22 + lVar12;
                uVar28 = local_1f8;
                pZVar27 = prefixStart;
                goto LAB_001853e7;
              }
              memmove(pZVar29,pBVar2,sVar22);
              uVar28 = local_1f8;
            }
          }
          else {
LAB_001853e7:
            if (pZVar20 < pZVar29) {
LAB_00185ccb:
              __assert_fail("op <= oMatchEnd",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa888,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (pZVar27 < prefixStart) {
LAB_00185cea:
              __assert_fail("match >= prefixStart",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa88a,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (sVar22 == 0) {
LAB_00185cac:
              __assert_fail("sequence.matchLength >= 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa88b,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (uVar21 < 0x10) {
              if (pZVar29 < pZVar27) {
LAB_00185e5e:
                __assert_fail("*ip <= *op",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa783,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (uVar21 < 8) {
                iVar9 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar21 * 4);
                *(byte *)&pZVar29->nextState = (byte)pZVar27->nextState;
                *(byte *)((long)&pZVar29->nextState + 1) = *(byte *)((long)&pZVar27->nextState + 1);
                pZVar29->nbAdditionalBits = pZVar27->nbAdditionalBits;
                pZVar29->nbBits = pZVar27->nbBits;
                pUVar7 = &pZVar27->nextState;
                pZVar27 = (ZSTD_seqSymbol *)
                          ((long)pZVar27 +
                          ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar21 * 4) - (long)iVar9
                          ));
                pZVar29->baseValue =
                     *(U32 *)((long)pUVar7 +
                             (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar21 * 4));
              }
              else {
                *pZVar29 = *pZVar27;
              }
              pZVar17 = pZVar27 + 1;
              pZVar18 = pZVar29 + 1;
              lVar12 = (long)pZVar18 - (long)pZVar17;
              if (lVar12 < 8) {
LAB_00185e7d:
                __assert_fail("*op - *ip >= 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa795,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (8 < sVar22) {
                if (pZVar20 <= pZVar18) {
LAB_00185e9c:
                  __assert_fail("op < oMatchEnd",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xa89f,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                pZVar20 = (ZSTD_seqSymbol *)((long)&pZVar29->nextState + sVar22);
                if (lVar12 < 0x10) {
                  do {
                    *pZVar18 = *pZVar17;
                    pZVar18 = pZVar18 + 1;
                    pZVar17 = pZVar17 + 1;
                  } while (pZVar18 < pZVar20);
                }
                else {
                  if (0xffffffffffffffe0 < lVar12 - 0x10U) goto LAB_00185bf2;
                  ZVar6 = pZVar27[2];
                  *pZVar18 = *pZVar17;
                  pZVar29[2] = ZVar6;
                  if (0x18 < (long)sVar22) {
                    lVar12 = 0;
                    do {
                      pbVar1 = (byte *)((long)&pZVar27[3].nextState + lVar12);
                      uVar5 = *(undefined8 *)(pbVar1 + 8);
                      pbVar26 = (byte *)((long)&pZVar29[3].nextState + lVar12);
                      *(undefined8 *)pbVar26 = *(undefined8 *)pbVar1;
                      *(undefined8 *)(pbVar26 + 8) = uVar5;
                      pbVar1 = (byte *)((long)&pZVar27[5].nextState + lVar12);
                      uVar5 = *(undefined8 *)(pbVar1 + 8);
                      *(undefined8 *)(pbVar26 + 0x10) = *(undefined8 *)pbVar1;
                      *(undefined8 *)(pbVar26 + 0x18) = uVar5;
                      lVar12 = lVar12 + 0x20;
                    } while ((ZSTD_seqSymbol *)(pbVar26 + 0x20) < pZVar20);
                  }
                }
              }
            }
            else {
              if ((byte *)0xffffffffffffffe0 < (byte *)((long)pZVar29 + (-0x10 - (long)pZVar27)))
              goto LAB_00185bf2;
              ZVar6 = pZVar27[1];
              *pZVar29 = *pZVar27;
              pZVar29[1] = ZVar6;
              if (0x10 < (long)sVar22) {
                lVar12 = 0x10;
                do {
                  pbVar26 = (byte *)((long)&pZVar27->nextState + lVar12);
                  uVar5 = *(undefined8 *)(pbVar26 + 8);
                  pbVar1 = (byte *)((long)&pZVar29->nextState + lVar12);
                  *(undefined8 *)pbVar1 = *(undefined8 *)pbVar26;
                  *(undefined8 *)(pbVar1 + 8) = uVar5;
                  pbVar26 = (byte *)((long)&pZVar27[2].nextState + lVar12);
                  uVar5 = *(undefined8 *)(pbVar26 + 8);
                  *(undefined8 *)(pbVar1 + 0x10) = *(undefined8 *)pbVar26;
                  *(undefined8 *)(pbVar1 + 0x18) = uVar5;
                  lVar12 = lVar12 + 0x20;
                } while (pbVar1 + 0x20 < (byte *)((long)&pZVar29->nextState + sVar22));
              }
            }
          }
        }
        else {
LAB_00185677:
          sequence_04.matchLength = (&local_f0)[uVar21 * 3];
          sequence_04.litLength = *puVar23;
          sequence_04.offset = local_e8[uVar21 * 3];
          uVar28 = ZSTD_execSequenceEnd
                             ((BYTE *)dst,(BYTE *)oend_00,sequence_04,&local_200,local_1b0,
                              (BYTE *)prefixStart,local_1e8,local_1f0);
        }
        bVar31 = uVar28 < 0xffffffffffffff89;
        if (!bVar31) {
          local_1d8 = uVar28;
          uVar28 = 0;
        }
        dst = (void *)((long)dst + uVar28);
        local_218 = local_1b0;
      }
      else {
        if (uVar30 <= (ulong)((long)oend_00 - (long)dst)) {
          ZSTD_safecopyDstBeforeSrc((BYTE *)dst,local_200,uVar30);
          *puVar23 = *puVar23 - uVar30;
          dst = (void *)((long)dst + uVar30);
          goto LAB_001852cb;
        }
        local_1d8 = 0xffffffffffffffba;
        bVar31 = false;
      }
      if (bVar31) goto LAB_0018551d;
      bVar31 = false;
      goto LAB_00185525;
    }
    if ((BYTE *)dst == (BYTE *)0x0) {
LAB_00185d47:
      __assert_fail("op != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8b1,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    pZVar20 = (ZSTD_seqSymbol *)(pbVar26 + -0x20);
    if (oend_00 <= pZVar20) {
LAB_00185d66:
      __assert_fail("oend_w < oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8b2,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (local_218 < pbVar26) {
LAB_0018558a:
      sequence_03.matchLength = (&local_f0)[uVar21 * 3];
      sequence_03.litLength = *puVar23;
      sequence_03.offset = local_e8[uVar21 * 3];
      uVar28 = ZSTD_execSequenceEndSplitLitBuffer
                         ((BYTE *)dst,(BYTE *)oend_00,(BYTE *)pZVar20,sequence_03,&local_200,
                          local_218,(BYTE *)prefixStart,local_1e8,local_1f0);
      goto LAB_0018548c;
    }
    sVar22 = (&local_f0)[uVar21 * 3];
    uVar28 = sVar22 + uVar30;
    pZVar29 = (ZSTD_seqSymbol *)((long)dst + uVar28);
    if (pZVar20 < pZVar29) goto LAB_0018558a;
    if ((long)uVar30 < 0) {
LAB_00185dc3:
      __assert_fail("op <= oLitEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8bf,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if ((long)uVar28 <= (long)uVar30) {
LAB_00185de2:
      __assert_fail("oLitEnd < oMatchEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8c0,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (oend_00 < pZVar29) {
LAB_00185da4:
      __assert_fail("oMatchEnd <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8c1,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    pZVar27 = (ZSTD_seqSymbol *)((long)dst + uVar30);
    if (pZVar20 < pZVar27) {
LAB_00185d85:
      __assert_fail("oLitEnd <= oend_w",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8c3,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    uVar21 = local_e8[uVar21 * 3];
    uVar5 = *(undefined8 *)(local_200 + 8);
    *(undefined8 *)dst = *(undefined8 *)local_200;
    *(undefined8 *)((long)dst + 8) = uVar5;
    local_1b8 = pZVar29;
    if (0x10 < uVar30) {
      ZSTD_decompressSequencesLong_cold_2();
    }
    pZVar20 = (ZSTD_seqSymbol *)((long)pZVar27 - uVar21);
    local_200 = pbVar26;
    if ((ulong)((long)pZVar27 - (long)prefixStart) < uVar21) {
      local_1f8 = uVar28;
      if ((ulong)((long)pZVar27 - (long)local_1e8) < uVar21) goto LAB_001858a4;
      lVar12 = (long)((long)pZVar27 - uVar21) - (long)prefixStart;
      pBVar2 = local_1f0 + lVar12;
      if (pBVar2 + sVar22 <= local_1f0) {
        memmove(pZVar27,pBVar2,sVar22);
        uVar28 = local_1f8;
        goto LAB_0018548c;
      }
      memmove(pZVar27,pBVar2,-lVar12);
      pZVar27 = (ZSTD_seqSymbol *)((long)pZVar27 - lVar12);
      sVar22 = sVar22 + lVar12;
      uVar28 = local_1f8;
      pZVar20 = prefixStart;
    }
    if (local_1b8 < pZVar27) {
LAB_00185e3f:
      __assert_fail("op <= oMatchEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8e3,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (pZVar20 < prefixStart) {
LAB_00185e20:
      __assert_fail("match >= prefixStart",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8e5,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (sVar22 == 0) {
LAB_00185e01:
      __assert_fail("sequence.matchLength >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8e6,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (uVar21 < 0x10) {
      if (pZVar27 < pZVar20) goto LAB_00185e5e;
      if (uVar21 < 8) {
        iVar9 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar21 * 4);
        *(byte *)&pZVar27->nextState = (byte)pZVar20->nextState;
        *(byte *)((long)&pZVar27->nextState + 1) = *(byte *)((long)&pZVar20->nextState + 1);
        pZVar27->nbAdditionalBits = pZVar20->nbAdditionalBits;
        pZVar27->nbBits = pZVar20->nbBits;
        pUVar7 = &pZVar20->nextState;
        pZVar20 = (ZSTD_seqSymbol *)
                  ((long)pZVar20 +
                  ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar21 * 4) - (long)iVar9));
        pZVar27->baseValue =
             *(U32 *)((long)pUVar7 + (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar21 * 4));
      }
      else {
        *pZVar27 = *pZVar20;
      }
      pZVar29 = pZVar20 + 1;
      pZVar17 = pZVar27 + 1;
      lVar12 = (long)pZVar17 - (long)pZVar29;
      if (lVar12 < 8) goto LAB_00185e7d;
      if (sVar22 < 9) goto LAB_0018548c;
      if (local_1b8 <= pZVar17) {
LAB_00185ebb:
        __assert_fail("op < oMatchEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa8fa,
                      "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      pZVar18 = (ZSTD_seqSymbol *)((long)&pZVar27->nextState + sVar22);
      if (lVar12 < 0x10) {
        do {
          *pZVar17 = *pZVar29;
          pZVar17 = pZVar17 + 1;
          pZVar29 = pZVar29 + 1;
        } while (pZVar17 < pZVar18);
      }
      else {
        if (0xffffffffffffffe0 < lVar12 - 0x10U) goto LAB_00185bf2;
        ZVar6 = pZVar20[2];
        *pZVar17 = *pZVar29;
        pZVar27[2] = ZVar6;
        if (0x18 < (long)sVar22) {
          lVar12 = 0;
          do {
            pbVar1 = (byte *)((long)&pZVar20[3].nextState + lVar12);
            uVar5 = *(undefined8 *)(pbVar1 + 8);
            pbVar26 = (byte *)((long)&pZVar27[3].nextState + lVar12);
            *(undefined8 *)pbVar26 = *(undefined8 *)pbVar1;
            *(undefined8 *)(pbVar26 + 8) = uVar5;
            pbVar1 = (byte *)((long)&pZVar20[5].nextState + lVar12);
            uVar5 = *(undefined8 *)(pbVar1 + 8);
            *(undefined8 *)(pbVar26 + 0x10) = *(undefined8 *)pbVar1;
            *(undefined8 *)(pbVar26 + 0x18) = uVar5;
            lVar12 = lVar12 + 0x20;
          } while ((ZSTD_seqSymbol *)(pbVar26 + 0x20) < pZVar18);
        }
      }
    }
    else {
      if ((byte *)0xffffffffffffffe0 < (byte *)((long)pZVar27 + (-0x10 - (long)pZVar20)))
      goto LAB_00185bf2;
      ZVar6 = pZVar20[1];
      *pZVar27 = *pZVar20;
      pZVar27[1] = ZVar6;
      if (0x10 < (long)sVar22) {
        lVar12 = 0x10;
        do {
          pbVar26 = (byte *)((long)&pZVar20->nextState + lVar12);
          uVar5 = *(undefined8 *)(pbVar26 + 8);
          pbVar1 = (byte *)((long)&pZVar27->nextState + lVar12);
          *(undefined8 *)pbVar1 = *(undefined8 *)pbVar26;
          *(undefined8 *)(pbVar1 + 8) = uVar5;
          pbVar26 = (byte *)((long)&pZVar20[2].nextState + lVar12);
          uVar5 = *(undefined8 *)(pbVar26 + 8);
          *(undefined8 *)(pbVar1 + 0x10) = *(undefined8 *)pbVar26;
          *(undefined8 *)(pbVar1 + 0x18) = uVar5;
          lVar12 = lVar12 + 0x20;
        } while (pbVar1 + 0x20 < (byte *)((long)&pZVar27->nextState + sVar22));
      }
    }
  }
  else {
    if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00185c11;
    uVar30 = *puVar23;
    pbVar26 = local_200 + uVar30;
    if (local_218 < pbVar26) {
LAB_0018553f:
      sequence_02.matchLength = (&local_f0)[uVar21 * 3];
      sequence_02.litLength = *puVar23;
      sequence_02.offset = local_e8[uVar21 * 3];
      uVar28 = ZSTD_execSequenceEnd
                         ((BYTE *)dst,(BYTE *)oend_00,sequence_02,&local_200,local_218,
                          (BYTE *)prefixStart,local_1e8,local_1f0);
    }
    else {
      sVar22 = (&local_f0)[uVar21 * 3];
      uVar28 = sVar22 + uVar30;
      pZVar20 = (ZSTD_seqSymbol *)((long)dst + uVar28);
      if (local_1c0 < pZVar20) goto LAB_0018553f;
      if ((long)uVar30 < 0) goto LAB_00185c4f;
      if ((long)uVar28 <= (long)uVar30) goto LAB_00185c30;
      if (oend_00 < pZVar20) goto LAB_00185c6e;
      pZVar29 = (ZSTD_seqSymbol *)((long)dst + uVar30);
      if (local_1c0 < pZVar29) goto LAB_00185c8d;
      uVar21 = local_e8[uVar21 * 3];
      uVar5 = *(undefined8 *)(local_200 + 8);
      *(undefined8 *)dst = *(undefined8 *)local_200;
      *(undefined8 *)((long)dst + 8) = uVar5;
      if (0x10 < uVar30) {
        ZSTD_decompressSequencesLong_cold_1();
      }
      pZVar27 = (ZSTD_seqSymbol *)((long)pZVar29 - uVar21);
      local_200 = pbVar26;
      if ((ulong)((long)pZVar29 - (long)prefixStart) < uVar21) {
        local_1f8 = uVar28;
        if ((ulong)((long)pZVar29 - (long)local_1e8) < uVar21) {
LAB_001858a4:
          uVar28 = 0xffffffffffffffec;
        }
        else {
          lVar12 = (long)((long)pZVar29 - uVar21) - (long)prefixStart;
          pBVar2 = local_1f0 + lVar12;
          if (local_1f0 < pBVar2 + sVar22) {
            memmove(pZVar29,pBVar2,-lVar12);
            pZVar29 = (ZSTD_seqSymbol *)((long)pZVar29 - lVar12);
            sVar22 = sVar22 + lVar12;
            uVar28 = local_1f8;
            pZVar27 = prefixStart;
            goto LAB_0018507c;
          }
          memmove(pZVar29,pBVar2,sVar22);
          uVar28 = local_1f8;
        }
      }
      else {
LAB_0018507c:
        if (pZVar20 < pZVar29) goto LAB_00185ccb;
        if (pZVar27 < prefixStart) goto LAB_00185cea;
        if (sVar22 == 0) goto LAB_00185cac;
        if (uVar21 < 0x10) {
          if (pZVar29 < pZVar27) goto LAB_00185e5e;
          if (uVar21 < 8) {
            iVar9 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar21 * 4);
            *(byte *)&pZVar29->nextState = (byte)pZVar27->nextState;
            *(byte *)((long)&pZVar29->nextState + 1) = *(byte *)((long)&pZVar27->nextState + 1);
            pZVar29->nbAdditionalBits = pZVar27->nbAdditionalBits;
            pZVar29->nbBits = pZVar27->nbBits;
            pUVar7 = &pZVar27->nextState;
            pZVar27 = (ZSTD_seqSymbol *)
                      ((long)pZVar27 +
                      ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar21 * 4) - (long)iVar9));
            pZVar29->baseValue =
                 *(U32 *)((long)pUVar7 + (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar21 * 4)
                         );
          }
          else {
            *pZVar29 = *pZVar27;
          }
          pZVar17 = pZVar27 + 1;
          pZVar18 = pZVar29 + 1;
          lVar12 = (long)pZVar18 - (long)pZVar17;
          if (lVar12 < 8) goto LAB_00185e7d;
          if (8 < sVar22) {
            if (pZVar20 <= pZVar18) goto LAB_00185e9c;
            pZVar20 = (ZSTD_seqSymbol *)((long)&pZVar29->nextState + sVar22);
            if (lVar12 < 0x10) {
              do {
                *pZVar18 = *pZVar17;
                pZVar18 = pZVar18 + 1;
                pZVar17 = pZVar17 + 1;
              } while (pZVar18 < pZVar20);
            }
            else {
              if (0xffffffffffffffe0 < lVar12 - 0x10U) goto LAB_00185bf2;
              ZVar6 = pZVar27[2];
              *pZVar18 = *pZVar17;
              pZVar29[2] = ZVar6;
              if (0x18 < (long)sVar22) {
                lVar12 = 0;
                do {
                  pbVar1 = (byte *)((long)&pZVar27[3].nextState + lVar12);
                  uVar5 = *(undefined8 *)(pbVar1 + 8);
                  pbVar26 = (byte *)((long)&pZVar29[3].nextState + lVar12);
                  *(undefined8 *)pbVar26 = *(undefined8 *)pbVar1;
                  *(undefined8 *)(pbVar26 + 8) = uVar5;
                  pbVar1 = (byte *)((long)&pZVar27[5].nextState + lVar12);
                  uVar5 = *(undefined8 *)(pbVar1 + 8);
                  *(undefined8 *)(pbVar26 + 0x10) = *(undefined8 *)pbVar1;
                  *(undefined8 *)(pbVar26 + 0x18) = uVar5;
                  lVar12 = lVar12 + 0x20;
                } while ((ZSTD_seqSymbol *)(pbVar26 + 0x20) < pZVar20);
              }
            }
          }
        }
        else {
          if ((byte *)0xffffffffffffffe0 < (byte *)((long)pZVar29 + (-0x10 - (long)pZVar27)))
          goto LAB_00185bf2;
          ZVar6 = pZVar27[1];
          *pZVar29 = *pZVar27;
          pZVar29[1] = ZVar6;
          if (0x10 < (long)sVar22) {
            lVar12 = 0x10;
            do {
              pbVar26 = (byte *)((long)&pZVar27->nextState + lVar12);
              uVar5 = *(undefined8 *)(pbVar26 + 8);
              pbVar1 = (byte *)((long)&pZVar29->nextState + lVar12);
              *(undefined8 *)pbVar1 = *(undefined8 *)pbVar26;
              *(undefined8 *)(pbVar1 + 8) = uVar5;
              pbVar26 = (byte *)((long)&pZVar27[2].nextState + lVar12);
              uVar5 = *(undefined8 *)(pbVar26 + 8);
              *(undefined8 *)(pbVar1 + 0x10) = *(undefined8 *)pbVar26;
              *(undefined8 *)(pbVar1 + 0x18) = uVar5;
              lVar12 = lVar12 + 0x20;
            } while (pbVar1 + 0x20 < (byte *)((long)&pZVar29->nextState + sVar22));
          }
        }
      }
    }
  }
LAB_0018548c:
  bVar31 = false;
  uVar21 = uVar28;
  if (0xffffffffffffff88 < uVar28) {
    local_1d8 = uVar28;
    uVar21 = 0;
  }
  dst = (void *)((long)dst + uVar21);
  if (uVar28 < 0xffffffffffffff89) {
LAB_0018551d:
    bVar31 = true;
  }
LAB_00185525:
  if (!bVar31) {
    bVar31 = false;
    unaff_R12 = local_1d8;
    goto LAB_00185aac;
  }
  uVar8 = uVar8 + 1;
  goto joined_r0x00184ef1;
LAB_00184eda:
  bVar31 = false;
  goto LAB_00185aac;
LAB_00185a84:
  lVar12 = 0;
  do {
    (dctx->entropy).rep[lVar12] = *(U32 *)(local_150 + lVar12);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  bVar31 = true;
  unaff_R12 = local_1d8;
LAB_00185aac:
  if (bVar31) {
LAB_00185abc:
    if (dctx->litBufferLocation == ZSTD_split) {
      uVar30 = (long)local_218 - (long)local_200;
      uVar21 = (long)oend_00 - (long)dst;
      if (uVar21 < uVar30) {
        unaff_R12 = 0xffffffffffffffba;
      }
      else {
        if ((BYTE *)dst == (BYTE *)0x0) {
          dst = (BYTE *)0x0;
        }
        else {
          memmove(dst,local_200,uVar30);
          dst = (void *)((long)dst + uVar30);
        }
        local_200 = dctx->litExtraBuffer;
        local_218 = dctx->litExtraBuffer + 0x10000;
      }
      if (uVar21 < uVar30) {
        return unaff_R12;
      }
    }
    uVar30 = (long)local_218 - (long)local_200;
    uVar21 = (long)oend_00 - (long)dst;
    if (uVar21 < uVar30) {
      unaff_R12 = 0xffffffffffffffba;
    }
    else if ((BYTE *)dst == (BYTE *)0x0) {
      dst = (BYTE *)0x0;
    }
    else {
      memmove(dst,local_200,uVar30);
      dst = (void *)((long)dst + uVar30);
    }
    if (uVar30 <= uVar21) {
      unaff_R12 = (long)dst - (long)local_1d0;
    }
  }
  return unaff_R12;
}

Assistant:

static size_t
ZSTD_decompressSequencesLong(ZSTD_DCtx* dctx,
                             void* dst, size_t maxDstSize,
                             const void* seqStart, size_t seqSize, int nbSeq,
                             const ZSTD_longOffset_e isLongOffset,
                             const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesLong");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesLong_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
  return ZSTD_decompressSequencesLong_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}